

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O3

void __thiscall crnlib::dxt_hc::determine_tiles_task(dxt_hc *this,uint64 data,void *param_2)

{
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *paVar1;
  float fVar2;
  uint uVar3;
  color_quad_u8 (*pacVar4) [16];
  ulong uVar5;
  double dVar6;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aVar7;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aVar8;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aVar9;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  bool bVar19;
  uint uVar20;
  uint uVar21;
  byte bVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  color_quad_u8 *pcVar26;
  undefined4 *puVar27;
  color_quad_u8 *block;
  bool bVar28;
  uint uVar29;
  byte *pbVar30;
  uint8 c;
  uint uVar31;
  long lVar32;
  int iVar33;
  uint uVar34;
  ulong uVar35;
  int iVar36;
  byte *pbVar37;
  ulong uVar38;
  uint *puVar39;
  uint *puVar40;
  long lVar41;
  uint uVar42;
  uint uVar43;
  undefined4 *puVar44;
  ulong uVar45;
  ulong uVar46;
  uint e;
  ulong uVar47;
  tile_details *this_00;
  bool bVar48;
  float fVar49;
  float fVar50;
  uint low16;
  int scan [3];
  results results_1;
  int refine [4];
  results results;
  uint high16;
  etc1_optimizer optimizer;
  uint8 selectors [64];
  uint tile_error [3] [9];
  uint total_error [3] [8];
  color_quad_u8 tilePixels [128];
  color_quad_u8 block_colors [4];
  int local_a08;
  undefined4 local_9a8;
  undefined2 local_9a4;
  uint local_9a0;
  color_quad_u8 *local_998;
  undefined1 local_990;
  undefined8 *local_988;
  undefined4 local_980;
  undefined4 uStack_97c;
  undefined1 local_978;
  params local_970;
  long local_950;
  ulong local_948;
  uint64 local_940;
  float (*local_938) [8];
  undefined8 local_930;
  undefined4 local_928;
  results local_920;
  undefined8 local_908;
  undefined8 uStack_900;
  ulong local_8f0;
  uint local_8e0;
  byte *local_8d8;
  uint16 local_8c8 [16];
  etc1_optimizer local_8a8;
  byte local_7a8 [64];
  int aiStack_768 [9];
  undefined4 local_744 [19];
  uint auStack_6f8 [8];
  uint local_6d8 [16];
  color_quad_u8 acStack_698 [2];
  undefined8 auStack_690 [3];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aaStack_678 [4];
  undefined8 auStack_668 [26];
  undefined8 local_598;
  undefined4 auStack_590 [62];
  undefined1 local_498 [16];
  uchar *local_488;
  
  local_8a8.m_best_solution.m_selectors.m_p = (uchar *)0x0;
  local_8a8.m_best_solution.m_selectors.m_size = 0;
  local_8a8.m_best_solution.m_selectors.m_capacity = 0;
  local_8a8.m_luma.m_p = (unsigned_short *)0x0;
  local_8a8.m_luma.m_size = 0;
  local_8a8.m_luma.m_capacity = 0;
  local_8a8.m_sorted_luma[0].m_p = (uint *)0x0;
  local_8a8.m_sorted_luma[0].m_size = 0;
  local_8a8.m_sorted_luma[0].m_capacity = 0;
  local_8a8.m_sorted_luma[1].m_p = (uint *)0x0;
  local_8a8.m_sorted_luma[1].m_size = 0;
  local_8a8.m_sorted_luma[1].m_capacity = 0;
  local_8a8.m_selectors.m_p = (uchar *)0x0;
  local_8a8.m_selectors.m_size = 0;
  local_8a8.m_selectors.m_capacity = 0;
  local_8a8.m_best_selectors.m_p = (uchar *)0x0;
  local_8a8.m_best_selectors.m_size._0_1_ = 0;
  local_8a8.m_best_selectors._9_7_ = 0;
  local_8a8.m_best_solution.m_coords.m_unscaled_color.field_0.field_0.r = '\0';
  local_8a8.m_best_solution.m_coords._1_8_ = 0;
  local_8a8.m_best_solution.m_error = 0xffffffffffffffff;
  local_8a8.m_best_solution.m_valid = false;
  local_8a8.m_trial_solution.m_coords.m_unscaled_color.field_0 =
       (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
  local_8a8.m_trial_solution.m_coords.m_inten_table = 0;
  local_8a8.m_trial_solution.m_coords.m_color4 = false;
  local_8a8.m_trial_solution.m_selectors.m_p = (uchar *)0x0;
  local_8a8.m_trial_solution.m_selectors.m_size = 0;
  local_8a8.m_trial_solution.m_selectors.m_capacity = 0;
  local_8a8.m_trial_solution.m_error = 0xffffffffffffffff;
  local_8a8.m_trial_solution.m_valid = false;
  local_8a8.m_temp_selectors.m_p = (uchar *)0x0;
  local_8a8.m_temp_selectors.m_size = 0;
  local_8a8.m_temp_selectors.m_capacity = 0;
  local_8a8.m_pParams = (params *)0x0;
  local_8a8.m_pResult = (results *)0x0;
  local_8a8.m_pSorted_luma_indices = (uint32 *)0x0;
  local_8a8.m_pSorted_luma = (uint32 *)0x0;
  local_9a8 = 2;
  local_9a4 = 1;
  local_9a0 = 0;
  local_998 = (color_quad_u8 *)0x0;
  local_988 = (undefined8 *)&etc1_optimizer::params::clear_optimizer_params()::s_default_scan_delta;
  local_980 = 1;
  uStack_97c = 0;
  local_990 = 0;
  local_978 = 0;
  local_8d8 = local_7a8;
  local_930 = 0xffffffff;
  local_928 = 1;
  local_908 = 0xfffffffefffffffd;
  uStack_900 = 0x300000002;
  uVar31 = (this->m_params).m_num_levels;
  if (uVar31 != 0) {
    uVar23 = (ulong)(this->m_pTask_pool->m_num_threads + 1);
    local_950 = data + 1;
    local_938 = this->m_color_derating;
    uVar35 = 0;
    local_940 = data;
    do {
      uVar3 = (this->m_params).m_levels[uVar35].m_block_width;
      uVar25 = (ulong)(this->m_params).m_levels[uVar35].m_num_blocks / (ulong)uVar3;
      uVar5 = uVar25 / (this->m_params).m_num_faces;
      uVar42 = (uint)((uVar25 * data) / uVar23) & 0xfffffffe;
      uVar45 = (ulong)uVar42;
      uVar20 = (uint)((uVar25 * local_950) / uVar23) & 0xfffffffe;
      if (uVar42 < uVar20) {
        fVar2 = (this->m_params).m_levels[uVar35].m_weight;
        uVar25 = uVar45 % uVar5;
        uVar42 = uVar42 * uVar3 + (this->m_params).m_levels[uVar35].m_first_block;
        do {
          iVar36 = (int)uVar25;
          if (iVar36 == (int)uVar5) {
            uVar25 = 2;
            local_a08 = 4;
            uVar43 = uVar42;
          }
          else {
            local_a08 = (uint)((uVar25 & 2) == 0) * 8 + -4;
            uVar43 = ((iVar36 << 0x1e) >> 0x1f & uVar3 * 2 - 4) + uVar42;
            uVar25 = (ulong)(iVar36 + 2);
          }
          uVar21 = uVar42 + uVar3;
          if (uVar42 < uVar21) {
            do {
              local_948 = uVar45;
              pacVar4 = this->m_blocks;
              uVar45 = 0;
              do {
                uVar29 = uVar3;
                if ((uVar45 & 0x10) == 0) {
                  uVar29 = 0;
                }
                uVar29 = ((uVar42 + 1) - (uint)(uVar45 < 0x20)) + uVar29;
                uVar14 = *(undefined8 *)pacVar4[uVar29];
                uVar15 = *(undefined8 *)(pacVar4[uVar29] + 2);
                uVar16 = *(undefined8 *)(pacVar4[uVar29] + 4);
                uVar17 = *(undefined8 *)(pacVar4[uVar29] + 4 + 2);
                paVar1 = &pacVar4[uVar29][8].field_0;
                aVar7 = *paVar1;
                aVar8 = paVar1[1];
                aVar9 = paVar1[2];
                aVar10 = paVar1[3];
                uVar18 = *(undefined8 *)(pacVar4[uVar29] + 0xc + 2);
                *(undefined8 *)((long)auStack_668 + uVar45 * 4) =
                     *(undefined8 *)(pacVar4[uVar29] + 0xc);
                *(undefined8 *)((long)&local_598 + (uVar45 - 0x32) * 4) = uVar18;
                aaStack_678[uVar45] = aVar7;
                aaStack_678[uVar45 + 1] = aVar8;
                aaStack_678[uVar45 + 2] = aVar9;
                aaStack_678[uVar45 + 3] = aVar10;
                *(undefined8 *)(aaStack_678 + (uVar45 - 4)) = uVar16;
                *(undefined8 *)(aaStack_678 + (uVar45 - 2)) = uVar17;
                *(undefined8 *)(acStack_698 + uVar45) = uVar14;
                *(undefined8 *)((long)auStack_690 + uVar45 * 4) = uVar15;
                bVar48 = uVar45 < 0x30;
                uVar45 = uVar45 + 0x10;
              } while (bVar48);
              uVar45 = 0;
              do {
                uVar29 = uVar3;
                if (uVar45 < 0x20) {
                  uVar29 = 0;
                }
                puVar27 = (undefined4 *)
                          ((long)&pacVar4[uVar29 + uVar42 + (uint)(((uint)uVar45 >> 2 & 1) != 0)][0]
                                  .field_0 + (ulong)((uint)uVar45 & 0x18) * 2);
                uVar11 = puVar27[1];
                uVar12 = puVar27[2];
                uVar13 = puVar27[3];
                *(undefined4 *)((long)&local_598 + uVar45 * 4) = *puVar27;
                *(undefined4 *)((long)&local_598 + (uVar45 + 1) * 4) = uVar11;
                *(undefined4 *)((long)&local_598 + (uVar45 + 2) * 4) = uVar12;
                *(undefined4 *)((long)&local_598 + (uVar45 + 3) * 4) = uVar13;
                bVar48 = uVar45 < 0x3c;
                uVar45 = uVar45 + 4;
              } while (bVar48);
              puVar27 = local_744;
              uVar45 = 0;
              do {
                uVar29 = 0x10 << ((byte)(uVar45 >> 2) & 0x1f);
                block = acStack_698 + (uint)(&DAT_001b0820)[uVar45];
                if (this->m_has_etc_color_blocks == true) {
                  local_9a0 = uVar29;
                  local_998 = block;
                  local_8e0 = uVar29;
                  etc1_optimizer::init(&local_8a8,(EVP_PKEY_CTX *)&local_9a8);
                  local_988 = &local_930;
                  local_980 = 3;
                  etc1_optimizer::compute(&local_8a8);
                  if (local_9a0 * 0x177 < local_8f0) {
                    local_988 = &local_908;
                    local_980 = 4;
                    etc1_optimizer::compute(&local_8a8);
                  }
                  aiStack_768[uVar45] = (int)local_8f0;
                }
                else if (this->m_has_color_blocks == true) {
                  dxt_fast::compress_color_block
                            (uVar29,block,&local_970.m_block_index,(uint *)local_8c8,local_7a8,false
                            );
                  dxt1_block::get_block_colors4
                            ((color_quad_u8 *)local_498,(uint16)local_970.m_block_index,local_8c8[0]
                            );
                  uVar24 = 0;
                  iVar36 = 0;
                  pcVar26 = block;
                  do {
                    lVar41 = 0;
                    do {
                      iVar33 = (uint)(pcVar26->field_0).c[lVar41] -
                               (uint)(byte)local_498[lVar41 + (ulong)local_7a8[uVar24] * 4];
                      iVar36 = iVar36 + iVar33 * iVar33;
                      lVar41 = lVar41 + 1;
                    } while (lVar41 != 3);
                    uVar24 = uVar24 + 1;
                    pcVar26 = pcVar26 + 1;
                  } while (uVar24 != uVar29);
                  aiStack_768[uVar45] = iVar36;
                }
                if (this->m_num_alpha_blocks == 0) {
                  uVar24 = 0;
                }
                else {
                  uVar38 = 0;
                  puVar44 = puVar27;
                  do {
                    uVar31 = (this->m_params).m_alpha_component_indices[uVar38];
                    dxt5_endpoint_optimizer::dxt5_endpoint_optimizer
                              ((dxt5_endpoint_optimizer *)local_498);
                    local_970.m_block_index = 0;
                    local_970.m_comp_index = (uint)(byte)uVar31;
                    local_970.m_use_both_block_types = false;
                    local_970.m_quality = cCRNDXTQualityNormal;
                    local_920.m_pSelectors = local_7a8;
                    local_970.m_pPixels = block;
                    local_970.m_num_pixels = uVar29;
                    dxt5_endpoint_optimizer::compute
                              ((dxt5_endpoint_optimizer *)local_498,&local_970,&local_920);
                    dxt5_block::get_block_values8
                              ((uint *)local_8c8,(uint)local_920.m_first_endpoint,
                               (uint)local_920.m_second_endpoint);
                    uVar38 = uVar38 + 1;
                    *puVar44 = (undefined4)local_920.m_error;
                    dxt5_endpoint_optimizer::~dxt5_endpoint_optimizer
                              ((dxt5_endpoint_optimizer *)local_498);
                    uVar24 = (ulong)this->m_num_alpha_blocks;
                    puVar44 = puVar44 + 9;
                  } while (uVar38 < uVar24);
                }
                uVar45 = uVar45 + 1;
                puVar27 = puVar27 + 1;
              } while (uVar45 != 9);
              uVar29 = this->m_has_color_blocks ^ 1;
              uVar45 = (ulong)uVar29;
              while (uVar29 < (int)uVar24 + 1U) {
                pbVar30 = &DAT_001b07e0;
                uVar38 = 0;
                do {
                  lVar41 = uVar38 * 4;
                  uVar38 = uVar38 + 1;
                  iVar36 = 0;
                  uVar47 = uVar38 & 0xffffffff;
                  pbVar37 = pbVar30;
                  do {
                    iVar36 = iVar36 + aiStack_768[uVar45 * 9 + (ulong)*pbVar37];
                    bVar22 = (byte)uVar47;
                    uVar47 = (ulong)(bVar22 >> 1);
                    pbVar37 = pbVar37 + 1;
                  } while (1 < bVar22);
                  *(int *)((long)auStack_6f8 + lVar41 + (ulong)(uint)((int)uVar45 << 5)) = iVar36;
                  pbVar30 = pbVar30 + 4;
                } while (uVar38 != 8);
                bVar22 = (char)uVar45 + 1;
                uVar45 = (ulong)bVar22;
                uVar29 = (uint)bVar22;
              }
              fVar49 = 0.0;
              uVar47 = 0;
              puVar39 = local_6d8;
              uVar38 = 0;
              uVar45 = uVar24;
              do {
                uVar29 = (uint)uVar45;
                if (this->m_has_color_blocks == true) {
                  dVar6 = 999999.0;
                  if (auStack_6f8[uVar47] != 0) {
                    dVar6 = log10(255.0 / SQRT((double)auStack_6f8[uVar47] / 192.0));
                    dVar6 = dVar6 * 20.0;
                    uVar29 = this->m_num_alpha_blocks;
                    uVar24 = (ulong)uVar29;
                  }
                  fVar50 = 1.0;
                  if (uVar29 != 0) {
                    fVar50 = (this->m_params).m_adaptive_tile_color_alpha_weighting_ratio;
                  }
                  dVar6 = dVar6 - (double)local_938[uVar35][uVar47];
                  if (dVar6 <= 0.0) {
                    dVar6 = 0.0;
                  }
                  fVar50 = (float)dVar6 * fVar50;
                }
                else {
                  fVar50 = 0.0;
                }
                if (uVar29 == 0) {
                  uVar45 = 0;
                }
                else {
                  uVar46 = 0;
                  puVar40 = puVar39;
                  do {
                    dVar6 = 999999.0;
                    if (*puVar40 != 0) {
                      dVar6 = (double)*puVar40 * 0.015625;
                      if (dVar6 < 0.0) {
                        dVar6 = sqrt(dVar6);
                      }
                      else {
                        dVar6 = SQRT(dVar6);
                      }
                      dVar6 = log10(255.0 / dVar6);
                      dVar6 = dVar6 * 20.0;
                      uVar24 = (ulong)this->m_num_alpha_blocks;
                    }
                    uVar46 = uVar46 + 1;
                    dVar6 = dVar6 - (double)this->m_alpha_derating[uVar47];
                    if (dVar6 <= 0.0) {
                      dVar6 = 0.0;
                    }
                    fVar50 = fVar50 + (float)dVar6;
                    puVar40 = puVar40 + 8;
                    uVar45 = uVar24;
                  } while (uVar46 < uVar24);
                }
                if (fVar49 < fVar50) {
                  uVar38 = uVar47 & 0xffffffff;
                  fVar49 = fVar50;
                }
                uVar47 = uVar47 + 1;
                puVar39 = puVar39 + 1;
              } while (uVar47 != 8);
              lVar41 = 0;
              uVar29 = (int)uVar38 + 1;
              do {
                this_00 = (this->m_tiles).m_p + (uVar43 | (uint)lVar41);
                vector<crnlib::color_quad<unsigned_char,_int>_>::append
                          (&this_00->pixels,
                           acStack_698 +
                           (uint)(&DAT_001b0820)[(byte)(&DAT_001b07e0)[lVar41 + uVar38 * 4]],
                           0x10 << ((byte)(&DAT_001b07e0)[lVar41 + uVar38 * 4] >> 2 & 0x1f));
                this_00->weight = fVar2;
                if (this->m_has_color_blocks == true) {
                  palettize_color((vec6F *)local_498,this,(this_00->pixels).m_p,
                                  (this_00->pixels).m_size);
                  *(uchar **)((this_00->color_endpoint).m_s + 4) = local_488;
                  *(undefined8 *)(this_00->color_endpoint).m_s = local_498._0_8_;
                  *(undefined8 *)((this_00->color_endpoint).m_s + 2) = local_498._8_8_;
                }
                if (this->m_num_alpha_blocks != 0) {
                  uVar45 = 0;
                  do {
                    palettize_alpha((dxt_hc *)local_498,(color_quad_u8 *)this,
                                    (uint)(this_00->pixels).m_p,(this_00->pixels).m_size);
                    *(undefined8 *)this_00->alpha_endpoints[uVar45].m_s = local_498._0_8_;
                    uVar45 = uVar45 + 1;
                  } while (uVar45 < this->m_num_alpha_blocks);
                }
                lVar41 = lVar41 + 1;
                bVar48 = 1 < uVar29;
                uVar29 = uVar29 >> 1;
              } while (bVar48);
              lVar41 = 0;
              bVar48 = true;
              do {
                bVar19 = bVar48;
                uVar29 = uVar3;
                if (bVar19) {
                  uVar29 = 0;
                }
                lVar32 = 0;
                bVar48 = true;
                do {
                  bVar28 = bVar48;
                  uVar34 = uVar29 + uVar42 + (int)lVar32;
                  (this->m_block_encodings).m_p[uVar34] = (uchar)uVar38;
                  (this->m_tile_indices).m_p[uVar34] =
                       (byte)g_tile_map[lVar32 + lVar41 * 2 + uVar38 * 4] | uVar43;
                  lVar32 = 1;
                  bVar48 = false;
                } while (bVar28);
                lVar41 = 1;
                bVar48 = false;
              } while (bVar19);
              uVar42 = uVar42 + 2;
              uVar43 = uVar43 + local_a08;
              uVar45 = local_948;
            } while (uVar42 < uVar21);
            uVar21 = uVar42 + uVar3;
            data = local_940;
          }
          uVar43 = (int)uVar45 + 2;
          uVar45 = (ulong)uVar43;
          uVar42 = uVar21;
        } while (uVar43 < uVar20);
        uVar31 = (this->m_params).m_num_levels;
      }
      uVar35 = uVar35 + 1;
    } while (uVar35 < uVar31);
  }
  etc1_optimizer::~etc1_optimizer(&local_8a8);
  return;
}

Assistant:

void dxt_hc::determine_tiles_task(uint64 data, void*)
    {
        uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        uint offsets[9] = { 0, 16, 32, 48, 0, 32, 64, 96, 64 };
        uint8 tiles[8][4] = { { 8 }, { 6, 7 }, { 4, 5 }, { 6, 1, 3 }, { 7, 0, 2 }, { 4, 2, 3 }, { 5, 0, 1 }, { 0, 2, 1, 3 } };
        color_quad_u8 tilePixels[128];
        uint8 selectors[64];
        uint tile_error[3][9];
        uint total_error[3][8];

        etc1_optimizer optimizer;
        etc1_optimizer::params params;
        params.m_use_color4 = false;
        params.m_constrain_against_base_color5 = false;
        etc1_optimizer::results results;
        results.m_pSelectors = selectors;
        int scan[] = { -1, 0, 1 };
        int refine[] = { -3, -2, 2, 3 };

        for (uint level = 0; level < m_params.m_num_levels; level++)
        {
            float weight = m_params.m_levels[level].m_weight;
            uint width = m_params.m_levels[level].m_block_width;
            uint height = m_params.m_levels[level].m_num_blocks / width;
            uint faceHeight = height / m_params.m_num_faces;
            uint h = height * data / num_tasks & ~1;
            uint hEnd = height * (data + 1) / num_tasks & ~1;
            uint hFace = h % faceHeight;
            uint b = m_params.m_levels[level].m_first_block + h * width;

            for (; h < hEnd; h += 2, hFace += 2, b += width)
            {
                uint tile_offset = b;
                uint tile_offset_delta = 4;
                if (hFace == faceHeight)
                {
                    hFace = 0;
                }
                else if (hFace & 2)
                {
                    tile_offset_delta = -4;
                    tile_offset += (width << 1) + tile_offset_delta;
                }
                for (uint bNext = b + width; b < bNext; b += 2, tile_offset += tile_offset_delta)
                {
                    for (int t = 0; t < 64; t += 16)
                    {
                        memcpy(tilePixels + t, m_blocks[b + (t & 16 ? width : 0) + (t & 32 ? 1 : 0)], 64);
                    }
                    for (int t = 0; t < 64; t += 4)
                    {
                        memcpy(tilePixels + 64 + t, m_blocks[b + (t & 32 ? width : 0) + (t & 4 ? 1 : 0)] + (t >> 1 & 12), 16);
                    }

                    for (uint t = 0; t < 9; t++)
                    {
                        color_quad_u8* pixels = tilePixels + offsets[t];
                        uint size = 16 << (t >> 2);
                        if (m_has_etc_color_blocks)
                        {
                            params.m_pSrc_pixels = pixels;
                            params.m_num_src_pixels = results.m_n = size;
                            optimizer.init(params, results);
                            params.m_pScan_deltas = scan;
                            params.m_scan_delta_size = sizeof(scan) / sizeof(*scan);
                            optimizer.compute();
                            if (results.m_error > 375 * params.m_num_src_pixels)
                            {
                                params.m_pScan_deltas = refine;
                                params.m_scan_delta_size = sizeof(refine) / sizeof(*refine);
                                optimizer.compute();
                            }
                            tile_error[cColor][t] = results.m_error;
                        }
                        else if (m_has_color_blocks)
                        {
                            uint low16, high16;
                            dxt_fast::compress_color_block(size, pixels, low16, high16, selectors);
                            color_quad_u8 block_colors[4];
                            dxt1_block::get_block_colors4(block_colors, low16, high16);
                            uint error = 0;
                            for (uint p = 0; p < size; p++)
                            {
                                for (uint8 c = 0; c < 3; c++)
                                {
                                    uint delta = pixels[p][c] - block_colors[selectors[p]][c];
                                    error += delta * delta;
                                }
                            }
                            tile_error[cColor][t] = error;
                        }
                        for (uint a = 0; a < m_num_alpha_blocks; a++)
                        {
                            uint8 component = m_params.m_alpha_component_indices[a];
                            dxt5_endpoint_optimizer optimizer;
                            dxt5_endpoint_optimizer::params params;
                            dxt5_endpoint_optimizer::results results;
                            params.m_pPixels = pixels;
                            params.m_num_pixels = size;
                            params.m_comp_index = component;
                            params.m_use_both_block_types = false;
                            params.m_quality = cCRNDXTQualityNormal;
                            results.m_pSelectors = selectors;
                            optimizer.compute(params, results);
                            uint block_values[cDXT5SelectorValues];
                            dxt5_block::get_block_values8(block_values, results.m_first_endpoint, results.m_second_endpoint);
                            tile_error[cAlpha0 + a][t] = results.m_error;
                        }
                    }

                    for (uint8 c = m_has_color_blocks ? 0 : cAlpha0; c < cAlpha0 + m_num_alpha_blocks; c++)
                    {
                        for (uint8 e = 0; e < 8; e++)
                        {
                            total_error[c][e] = 0;
                            for (uint8 t = 0, s = e + 1; s; s >>= 1, t++)
                            {
                                total_error[c][e] += tile_error[c][tiles[e][t]];
                            }
                        }
                    }

                    float best_quality = 0.0f;
                    uint best_encoding = 0;
                    for (uint e = 0; e < 8; e++)
                    {
                        float quality = 0;
                        if (m_has_color_blocks)
                        {
                            double peakSNR = total_error[cColor][e] ? log10(255.0f / sqrt(total_error[cColor][e] / 192.0)) * 20.0f : 999999.0f;
                            quality = (float)math::maximum<double>(peakSNR - m_color_derating[level][e], 0.0f);
                            if (m_num_alpha_blocks)
                            {
                                quality *= m_params.m_adaptive_tile_color_alpha_weighting_ratio;
                            }
                        }
                        for (uint a = 0; a < m_num_alpha_blocks; a++)
                        {
                            double peakSNR = total_error[cAlpha0 + a][e] ? log10(255.0f / sqrt(total_error[cAlpha0 + a][e] / 64.0)) * 20.0f : 999999.0f;
                            quality += (float)math::maximum<double>(peakSNR - m_alpha_derating[e], 0.0f);
                        }
                        if (quality > best_quality)
                        {
                            best_quality = quality;
                            best_encoding = e;
                        }
                    }

                    for (uint tile_index = 0, s = best_encoding + 1; s; s >>= 1, tile_index++)
                    {
                        tile_details& tile = m_tiles[tile_offset | tile_index];
                        uint t = tiles[best_encoding][tile_index];
                        tile.pixels.append(tilePixels + offsets[t], 16 << (t >> 2));
                        tile.weight = weight;
                        if (m_has_color_blocks)
                        {
                            tile.color_endpoint = palettize_color(tile.pixels.get_ptr(), tile.pixels.size());
                        }
                        for (uint a = 0; a < m_num_alpha_blocks; a++)
                        {
                            tile.alpha_endpoints[a] = palettize_alpha(tile.pixels.get_ptr(), tile.pixels.size(), m_params.m_alpha_component_indices[a]);
                        }
                    }

                    for (uint by = 0; by < 2; by++)
                    {
                        for (uint bx = 0; bx < 2; bx++)
                        {
                            m_block_encodings[b + (by ? width : 0) + bx] = best_encoding;
                            m_tile_indices[b + (by ? width : 0) + bx] = tile_offset | g_tile_map[best_encoding][by][bx];
                        }
                    }
                }
            }
        }
    }